

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_log.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::WriteLogFun::GetFunctions(void)

{
  LogicalType varargs;
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffdfc;
  FunctionNullHandling in_stack_fffffffffffffe08;
  bind_lambda_function_t in_stack_fffffffffffffe10;
  scalar_function_t local_1e8;
  LogicalType local_1c0;
  LogicalType local_1a8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_190;
  LogicalType local_178;
  string local_160;
  ScalarFunction local_140;
  
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"write_log","");
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  LogicalType::LogicalType(&local_1a8,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_1a8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_190,__l,(allocator_type *)&stack0xfffffffffffffe17);
  LogicalType::LogicalType(&local_1c0,ANY);
  local_1e8.super__Function_base._M_functor._8_8_ = 0;
  local_1e8.super__Function_base._M_functor._M_unused._M_object = WriteLogFunction;
  local_1e8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_1e8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_178,ANY);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 1;
  varargs._0_8_ = &local_178;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffdf4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffdfc;
  ScalarFunction::ScalarFunction
            (&local_140,(vector<duckdb::LogicalType,_true> *)&local_190,&local_1c0,&local_1e8,
             WriteLogBind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffe08,
             in_stack_fffffffffffffe10);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_140);
  local_140.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_140.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_140.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_140.function.super__Function_base._M_manager)
              ((_Any_data *)&local_140.function,(_Any_data *)&local_140.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_140.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_178);
  if (local_1e8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1e8.super__Function_base._M_manager)
              ((_Any_data *)&local_1e8,(_Any_data *)&local_1e8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_1c0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_190);
  LogicalType::~LogicalType(&local_1a8);
  return in_RDI;
}

Assistant:

ScalarFunctionSet WriteLogFun::GetFunctions() {
	ScalarFunctionSet set("write_log");

	set.AddFunction(ScalarFunction({LogicalType::VARCHAR}, LogicalType::ANY, WriteLogFunction, WriteLogBind, nullptr,
	                               nullptr, nullptr, LogicalType::ANY, FunctionStability::VOLATILE));

	return set;
}